

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int x509_store_add(X509_STORE *ctx,void *x,int is_crl)

{
  X509_OBJECT *a;
  X509_OBJECT *pXVar1;
  size_t sVar2;
  uint local_38;
  uint local_34;
  int added;
  int ret;
  X509_OBJECT *obj;
  int is_crl_local;
  void *x_local;
  X509_STORE *ctx_local;
  
  if (x == (void *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    a = (X509_OBJECT *)X509_OBJECT_new();
    if (a == (X509_OBJECT *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      if (is_crl == 0) {
        a->type = 1;
        (a->data).ptr = (char *)x;
      }
      else {
        a->type = 2;
        (a->data).ptr = (char *)x;
      }
      X509_OBJECT_up_ref_count(a);
      CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
      local_34 = 1;
      local_38 = 0;
      pXVar1 = X509_OBJECT_retrieve_match((stack_st_X509_OBJECT *)ctx->objs,a);
      if (pXVar1 == (X509_OBJECT *)0x0) {
        sVar2 = sk_X509_OBJECT_push(ctx->objs,(X509_OBJECT *)a);
        local_38 = (uint)(sVar2 != 0);
        local_34 = local_38;
      }
      CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);
      if (local_38 == 0) {
        X509_OBJECT_free((X509_OBJECT *)a);
      }
      ctx_local._4_4_ = local_34;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int x509_store_add(X509_STORE *ctx, void *x, int is_crl) {
  if (x == NULL) {
    return 0;
  }

  X509_OBJECT *const obj = X509_OBJECT_new();
  if (obj == NULL) {
    return 0;
  }

  if (is_crl) {
    obj->type = X509_LU_CRL;
    obj->data.crl = (X509_CRL *)x;
  } else {
    obj->type = X509_LU_X509;
    obj->data.x509 = (X509 *)x;
  }
  X509_OBJECT_up_ref_count(obj);

  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);

  int ret = 1;
  int added = 0;
  // Duplicates are silently ignored
  if (!X509_OBJECT_retrieve_match(ctx->objs, obj)) {
    ret = added = (sk_X509_OBJECT_push(ctx->objs, obj) != 0);
  }

  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (!added) {
    X509_OBJECT_free(obj);
  }

  return ret;
}